

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joystickmenu.cpp
# Opt level: O0

FOptionMenuDescriptor * UpdateJoystickConfigMenu(IJoystickConfig *joy)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FOptionMenuItem **ppFVar4;
  FOptionMenuSliderJoyDeadZone *pFVar5;
  char *pcVar6;
  FOptionMenuItem *pFVar7;
  FOptionMenuSliderJoyScale *this;
  int local_5c;
  int i_1;
  uint local_3c;
  FOptionMenuSliderJoyDeadZone *pFStack_38;
  uint i;
  FOptionMenuItem *it;
  FOptionMenuDescriptor *opt;
  FMenuDescriptor **local_20;
  FMenuDescriptor **desc;
  IJoystickConfig *joy_local;
  
  desc = (FMenuDescriptor **)joy;
  FName::FName((FName *)((long)&opt + 4),NAME_JoystickConfigMenu);
  local_20 = TMap<FName,_FMenuDescriptor_*,_THashTraits<FName>,_TValueTraits<FMenuDescriptor_*>_>::
             CheckKey(&MenuDescriptors,(FName *)((long)&opt + 4));
  if ((local_20 == (FMenuDescriptor **)0x0) || ((*local_20)->mType != 1)) {
    joy_local = (IJoystickConfig *)0x0;
  }
  else {
    it = (FOptionMenuItem *)*local_20;
    for (local_3c = 0; uVar1 = local_3c,
        uVar2 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                          ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1)), uVar1 < uVar2;
        local_3c = local_3c + 1) {
      ppFVar4 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::operator[]
                          ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),(ulong)local_3c)
      ;
      if (*ppFVar4 != (FOptionMenuItem *)0x0) {
        (*((*ppFVar4)->super_FListMenuItem)._vptr_FListMenuItem[1])();
      }
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Clear
                ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1));
    }
    if (desc == (FMenuDescriptor **)0x0) {
      FString::operator=((FString *)&it[1].super_FListMenuItem.mAction,"Configure Controller");
      pFVar5 = (FOptionMenuSliderJoyDeadZone *)operator_new(0x28);
      FOptionMenuItemStaticText::FOptionMenuItemStaticText
                ((FOptionMenuItemStaticText *)pFVar5,"Invalid controller specified for menu",false);
      pFStack_38 = pFVar5;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                 (FOptionMenuItem **)&stack0xffffffffffffffc8);
    }
    else {
      pFVar7 = it + 1;
      (*(code *)((*desc)->mNetgameMessage).Chars)();
      pcVar6 = FString::GetChars((FString *)&stack0xffffffffffffffa8);
      FString::Format((FString *)&(pFVar7->super_FListMenuItem).mAction,"Configure %s",pcVar6);
      FString::~FString((FString *)&stack0xffffffffffffffa8);
      SELECTED_JOYSTICK = (IJoystickConfig *)desc;
      pFVar7 = (FOptionMenuItem *)operator_new(0x50);
      FOptionMenuSliderJoySensitivity::FOptionMenuSliderJoySensitivity
                ((FOptionMenuSliderJoySensitivity *)pFVar7,"Overall sensitivity",0.0,2.0,0.1,3);
      pFStack_38 = (FOptionMenuSliderJoyDeadZone *)pFVar7;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                 (FOptionMenuItem **)&stack0xffffffffffffffc8);
      pFVar7 = (FOptionMenuItem *)operator_new(0x28);
      FOptionMenuItemStaticText::FOptionMenuItemStaticText
                ((FOptionMenuItemStaticText *)pFVar7," ",false);
      pFStack_38 = (FOptionMenuSliderJoyDeadZone *)pFVar7;
      TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                 (FOptionMenuItem **)&stack0xffffffffffffffc8);
      iVar3 = (*(code *)(*desc)[1]._vptr_FMenuDescriptor)();
      if (iVar3 < 1) {
        pFVar5 = (FOptionMenuSliderJoyDeadZone *)operator_new(0x28);
        FOptionMenuItemStaticText::FOptionMenuItemStaticText
                  ((FOptionMenuItemStaticText *)pFVar5,"No configurable axes",false);
        pFStack_38 = pFVar5;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                   (FOptionMenuItem **)&stack0xffffffffffffffc8);
      }
      else {
        pFVar5 = (FOptionMenuSliderJoyDeadZone *)operator_new(0x28);
        FOptionMenuItemStaticText::FOptionMenuItemStaticText
                  ((FOptionMenuItemStaticText *)pFVar5,"Axis Configuration",true);
        pFStack_38 = pFVar5;
        TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                  ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                   (FOptionMenuItem **)&stack0xffffffffffffffc8);
        for (local_5c = 0; iVar3 = (*(code *)(*desc)[1]._vptr_FMenuDescriptor)(), local_5c < iVar3;
            local_5c = local_5c + 1) {
          pFVar7 = (FOptionMenuItem *)operator_new(0x28);
          FOptionMenuItemStaticText::FOptionMenuItemStaticText
                    ((FOptionMenuItemStaticText *)pFVar7," ",false);
          pFStack_38 = (FOptionMenuSliderJoyDeadZone *)pFVar7;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                    ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                     (FOptionMenuItem **)&stack0xffffffffffffffc8);
          pFVar7 = (FOptionMenuItem *)operator_new(0x38);
          pcVar6 = (char *)(**(code **)&(*desc)[1].mType)(desc,local_5c);
          FOptionMenuItemJoyMap::FOptionMenuItemJoyMap
                    ((FOptionMenuItemJoyMap *)pFVar7,pcVar6,local_5c,"JoyAxisMapNames",0);
          pFStack_38 = (FOptionMenuSliderJoyDeadZone *)pFVar7;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                    ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                     (FOptionMenuItem **)&stack0xffffffffffffffc8);
          this = (FOptionMenuSliderJoyScale *)operator_new(0x58);
          FOptionMenuSliderJoyScale::FOptionMenuSliderJoyScale
                    (this,"Overall sensitivity",local_5c,0.0,4.0,0.1,3);
          pFStack_38 = (FOptionMenuSliderJoyDeadZone *)this;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                    ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                     (FOptionMenuItem **)&stack0xffffffffffffffc8);
          pFVar7 = (FOptionMenuItem *)operator_new(0x38);
          FOptionMenuItemInverter::FOptionMenuItemInverter
                    ((FOptionMenuItemInverter *)pFVar7,"Invert",local_5c,0);
          pFStack_38 = (FOptionMenuSliderJoyDeadZone *)pFVar7;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                    ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                     (FOptionMenuItem **)&stack0xffffffffffffffc8);
          pFVar5 = (FOptionMenuSliderJoyDeadZone *)operator_new(0x58);
          FOptionMenuSliderJoyDeadZone::FOptionMenuSliderJoyDeadZone
                    (pFVar5,"Dead Zone",local_5c,0.0,0.9,0.05,3);
          pFStack_38 = pFVar5;
          TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Push
                    ((TArray<FOptionMenuItem_*,_FOptionMenuItem_*> *)(it + 1),
                     (FOptionMenuItem **)&stack0xffffffffffffffc8);
        }
      }
    }
    *(undefined4 *)&it[1].field_0x24 = 0;
    *(undefined4 *)&it[1].mLabel.Chars = 0xffffffff;
    *(undefined4 *)&it[2].super_FListMenuItem._vptr_FListMenuItem = 0;
    *(undefined4 *)((long)&it[2].super_FListMenuItem._vptr_FListMenuItem + 4) = 0xffffffe7;
    FOptionMenuDescriptor::CalcIndent((FOptionMenuDescriptor *)it);
    joy_local = (IJoystickConfig *)it;
  }
  return (FOptionMenuDescriptor *)joy_local;
}

Assistant:

FOptionMenuDescriptor *UpdateJoystickConfigMenu(IJoystickConfig *joy)
{
	FMenuDescriptor **desc = MenuDescriptors.CheckKey(NAME_JoystickConfigMenu);
	if (desc != NULL && (*desc)->mType == MDESC_OptionsMenu)
	{
		FOptionMenuDescriptor *opt = (FOptionMenuDescriptor *)*desc;
		FOptionMenuItem *it;
		for(unsigned i=0;i<opt->mItems.Size();i++)
		{
			delete opt->mItems[i];
			opt->mItems.Clear();
		}
		if (joy == NULL)
		{
			opt->mTitle = "Configure Controller";
			it = new FOptionMenuItemStaticText("Invalid controller specified for menu", false);
			opt->mItems.Push(it);
		}
		else
		{
			opt->mTitle.Format("Configure %s", joy->GetName().GetChars());

			SELECTED_JOYSTICK = joy;

			it = new FOptionMenuSliderJoySensitivity("Overall sensitivity", 0, 2, 0.1, 3);
			opt->mItems.Push(it);
			it = new FOptionMenuItemStaticText(" ", false);
			opt->mItems.Push(it);

			if (joy->GetNumAxes() > 0)
			{
				it = new FOptionMenuItemStaticText("Axis Configuration", true);
				opt->mItems.Push(it);

				for (int i = 0; i < joy->GetNumAxes(); ++i)
				{
					it = new FOptionMenuItemStaticText(" ", false);
					opt->mItems.Push(it);

					it = new FOptionMenuItemJoyMap(joy->GetAxisName(i), i, "JoyAxisMapNames", false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyScale("Overall sensitivity", i, 0, 4, 0.1, 3);
					opt->mItems.Push(it);
					it = new FOptionMenuItemInverter("Invert", i, false);
					opt->mItems.Push(it);
					it = new FOptionMenuSliderJoyDeadZone("Dead Zone", i, 0, 0.9, 0.05, 3);
					opt->mItems.Push(it);
				}
			}
			else
			{
				it = new FOptionMenuItemStaticText("No configurable axes", false);
				opt->mItems.Push(it);
			}
		}
		opt->mScrollPos = 0;
		opt->mSelectedItem = -1;
		opt->mIndent = 0;
		opt->mPosition = -25;
		opt->CalcIndent();
		return opt;
	}
	return NULL;
}